

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Char * Diligent::GetShaderTypeLiteralName(SHADER_TYPE ShaderType)

{
  uint *in_RCX;
  string msg;
  SHADER_TYPE local_2c;
  string local_28;
  
  if ((int)ShaderType < 0x80) {
    if ((int)ShaderType < 0x10) {
      in_RCX = &switchD_005104bb::switchdataD_00774b34;
      switch(ShaderType) {
      case SHADER_TYPE_UNKNOWN:
        return "SHADER_TYPE_UNKNOWN";
      case SHADER_TYPE_VERTEX:
        return "SHADER_TYPE_VERTEX";
      case SHADER_TYPE_PIXEL:
        return "SHADER_TYPE_PIXEL";
      case SHADER_TYPE_GEOMETRY:
        return "SHADER_TYPE_GEOMETRY";
      case SHADER_TYPE_HULL:
        return "SHADER_TYPE_HULL";
      }
    }
    else {
      if (ShaderType == SHADER_TYPE_DOMAIN) {
        return "SHADER_TYPE_DOMAIN";
      }
      if (ShaderType == SHADER_TYPE_COMPUTE) {
        return "SHADER_TYPE_COMPUTE";
      }
      if (ShaderType == SHADER_TYPE_AMPLIFICATION) {
        return "SHADER_TYPE_AMPLIFICATION";
      }
    }
  }
  else if ((int)ShaderType < 0x800) {
    if ((int)ShaderType < 0x200) {
      if (ShaderType == SHADER_TYPE_MESH) {
        return "SHADER_TYPE_MESH";
      }
      if (ShaderType == SHADER_TYPE_RAY_GEN) {
        return "SHADER_TYPE_RAY_GEN";
      }
    }
    else {
      if (ShaderType == SHADER_TYPE_RAY_MISS) {
        return "SHADER_TYPE_RAY_MISS";
      }
      if (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT) {
        return "SHADER_TYPE_RAY_CLOSEST_HIT";
      }
    }
  }
  else if ((int)ShaderType < 0x2000) {
    if (ShaderType == SHADER_TYPE_RAY_ANY_HIT) {
      return "SHADER_TYPE_RAY_ANY_HIT";
    }
    if (ShaderType == SHADER_TYPE_RAY_INTERSECTION) {
      return "SHADER_TYPE_RAY_INTERSECTION";
    }
  }
  else {
    if (ShaderType == SHADER_TYPE_CALLABLE) {
      return "SHADER_TYPE_CALLABLE";
    }
    if (ShaderType == SHADER_TYPE_LAST) {
      return "SHADER_TYPE_TILE";
    }
  }
  local_2c = ShaderType;
  FormatString<char[30],unsigned_int>
            (&local_28,(Diligent *)"Unknown shader type constant ",(char (*) [30])&local_2c,in_RCX);
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"GetShaderTypeLiteralName",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
             ,0x325);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return "<Unknown shader type>";
}

Assistant:

const Char* GetShaderTypeLiteralName(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please handle the new shader type in the switch below");
    switch (ShaderType)
    {
        // clang-format off
#define RETURN_SHADER_TYPE_NAME(ShaderType)\
        case ShaderType: return #ShaderType;

        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_UNKNOWN         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_VERTEX          )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_PIXEL           )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_GEOMETRY        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_HULL            )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_DOMAIN          )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_COMPUTE         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_AMPLIFICATION   )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_MESH            )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_GEN         )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_MISS        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_CLOSEST_HIT )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_ANY_HIT     )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_RAY_INTERSECTION)
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_CALLABLE        )
        RETURN_SHADER_TYPE_NAME(SHADER_TYPE_TILE            )
#undef  RETURN_SHADER_TYPE_NAME
            // clang-format on

        default: UNEXPECTED("Unknown shader type constant ", Uint32{ShaderType}); return "<Unknown shader type>";
    }
}